

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void matrixToHPR_new(TMATRIX *rotation,EulerAngles *hpr)

{
  KBOOL KVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float sgnh;
  KFLOAT64 ch;
  KFLOAT64 sh;
  float sgnr;
  KFLOAT64 cr_1;
  KFLOAT64 sr_1;
  KFLOAT64 sr;
  KFLOAT64 cr;
  KFLOAT64 cp;
  KFLOAT64 pitch;
  KFLOAT64 sin_pitch;
  EulerAngles *hpr_local;
  TMATRIX *rotation_local;
  
  fVar2 = clampVal<float>(-rotation->Data[0][2],1.0);
  dVar6 = asin((double)fVar2);
  KDIS::DATA_TYPE::EulerAngles::SetThetaInRadians(hpr,(KFLOAT32)(float)dVar6);
  dVar6 = cos(dVar6);
  KVar1 = equivalent<double>(dVar6,0.0,9.999999747378752e-06);
  if (KVar1) {
    fVar2 = clampVal<float>(rotation->Data[1][1],1.0);
    fVar3 = clampVal<float>(-rotation->Data[2][1],1.0);
    KDIS::DATA_TYPE::EulerAngles::SetPsiInRadians(hpr,0.0);
    dVar6 = atan2((double)fVar3,(double)fVar2);
    KDIS::DATA_TYPE::EulerAngles::SetPhiInRadians(hpr,(KFLOAT32)(float)dVar6);
  }
  else {
    fVar2 = clampVal<float>(rotation->Data[1][2],1.0);
    fVar3 = clampVal<float>(rotation->Data[2][2],1.0);
    fVar4 = clampVal<float>(rotation->Data[0][1],1.0);
    fVar5 = clampVal<float>(rotation->Data[0][0],1.0);
    dVar6 = atan2((double)fVar4,(double)fVar5);
    KDIS::DATA_TYPE::EulerAngles::SetPsiInRadians(hpr,(KFLOAT32)(float)dVar6);
    dVar6 = atan2((double)fVar2,(double)fVar3);
    KDIS::DATA_TYPE::EulerAngles::SetPhiInRadians(hpr,(KFLOAT32)(float)dVar6);
  }
  return;
}

Assistant:

void matrixToHPR_new( const TMATRIX& rotation, EulerAngles & hpr )
{
    static const float PRECISION = MAGIC_EPSILON;
    KFLOAT64 sin_pitch = clampVal( -rotation.Data[0][2], 1.0f ); // -mat(0,2)
    KFLOAT64 pitch = asin( sin_pitch );
    hpr.SetThetaInRadians( pitch );

    KFLOAT64 cp = cos( pitch );
    if (equivalent<double>(cp, 0, PRECISION))
    {
        KFLOAT64 cr = clampVal(rotation.Data[1][1],1.0f);
        KFLOAT64 sr = clampVal(-rotation.Data[2][1],1.0f);
        hpr.SetPsiInRadians( 0.0f );
        hpr.SetPhiInRadians( atan2( sr,cr ) );
    } else {
        KFLOAT64 sr = clampVal(rotation.Data[1][2],1.0f);
        KFLOAT64 cr = clampVal(rotation.Data[2][2],1.0f);
        float sgnr = (sr < 0) ? -1.0f : 1.0f;

        KFLOAT64 sh = clampVal(rotation.Data[0][1],1.0f);
        KFLOAT64 ch = clampVal(rotation.Data[0][0],1.0f);
        float sgnh = (sh < 0) ? -1.0f : 1.0f;

        //hpr.SetPsiInRadians( acos ( ch / cp )*sgnh );
        //hpr.SetPhiInRadians( acos( cr / cp)*sgnr);
        hpr.SetPsiInRadians( atan2 (sh,ch ) );
        hpr.SetPhiInRadians( atan2 (sr,cr ) );
    }
}